

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reporter.c
# Opt level: O0

TestReporter * create_reporter(void)

{
  CgreenBreadcrumb *pCVar1;
  TestReporter *reporter;
  CgreenBreadcrumb *breadcrumb;
  TestReporter *local_8;
  
  local_8 = (TestReporter *)malloc(0x98);
  if (local_8 == (TestReporter *)0x0) {
    local_8 = (TestReporter *)0x0;
  }
  else {
    pCVar1 = create_breadcrumb();
    if (pCVar1 == (CgreenBreadcrumb *)0x0) {
      free(local_8);
      local_8 = (TestReporter *)0x0;
    }
    else {
      local_8->destroy = destroy_reporter;
      local_8->start_suite = reporter_start_suite;
      local_8->start_test = reporter_start_test;
      local_8->show_pass = show_pass;
      local_8->show_skip = show_skip;
      local_8->show_fail = show_fail;
      local_8->show_incomplete = show_incomplete;
      local_8->assert_true = assert_true;
      local_8->finish_test = reporter_finish_test;
      local_8->finish_suite = reporter_finish_suite;
      local_8->passes = 0;
      local_8->skips = 0;
      local_8->failures = 0;
      local_8->exceptions = 0;
      local_8->duration = 0;
      local_8->total_passes = 0;
      local_8->total_skips = 0;
      local_8->total_failures = 0;
      local_8->total_exceptions = 0;
      local_8->total_duration = 0;
      local_8->breadcrumb = pCVar1;
      local_8->memo = (void *)0x0;
      local_8->options = (void *)0x0;
    }
  }
  return local_8;
}

Assistant:

TestReporter *create_reporter(void) {
    CgreenBreadcrumb *breadcrumb;
    TestReporter *reporter = (TestReporter *) malloc(sizeof(TestReporter));
    if (reporter == NULL) {
        return NULL;
    }

    breadcrumb = create_breadcrumb();
    if (breadcrumb == NULL) {
        free(reporter);
        return NULL;
    }

    reporter->destroy = &destroy_reporter;
    reporter->start_suite = &reporter_start_suite;
    reporter->start_test = &reporter_start_test;
    reporter->show_pass = &show_pass;
    reporter->show_skip = &show_skip;
    reporter->show_fail = &show_fail;
    reporter->show_incomplete = &show_incomplete;
    reporter->assert_true = &assert_true;
    reporter->finish_test = &reporter_finish_test;
    reporter->finish_suite = &reporter_finish_suite;
    reporter->passes = 0;
    reporter->skips = 0;
    reporter->failures = 0;
    reporter->exceptions = 0;
    reporter->duration = 0;
    reporter->total_passes = 0;
    reporter->total_skips = 0;
    reporter->total_failures = 0;
    reporter->total_exceptions = 0;
    reporter->total_duration = 0;
    reporter->breadcrumb = breadcrumb;
    reporter->memo = NULL;
    reporter->options = NULL;
    return reporter;
}